

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_eng.c
# Opt level: O2

int gost_ciphers(ENGINE *e,EVP_CIPHER **cipher,int **nids,int nid)

{
  GOST_cipher **ppGVar1;
  int iVar2;
  EVP_CIPHER *pEVar3;
  long lVar4;
  
  if (cipher == (EVP_CIPHER **)0x0) {
    *nids = known_cipher_nids;
    iVar2 = 0x14;
    for (lVar4 = 0; lVar4 != 0x50; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)known_cipher_nids + lVar4) =
           *(undefined4 *)(*(long *)((long)gost_cipher_array + lVar4 * 2) + 8);
    }
  }
  else {
    iVar2 = 0;
    lVar4 = 0;
    do {
      if (lVar4 == 0x14) {
        pEVar3 = (EVP_CIPHER *)0x0;
        goto LAB_0010e038;
      }
      ppGVar1 = gost_cipher_array + lVar4;
      lVar4 = lVar4 + 1;
    } while ((*ppGVar1)->nid != nid);
    pEVar3 = GOST_init_cipher(*ppGVar1);
    iVar2 = 1;
LAB_0010e038:
    *cipher = pEVar3;
  }
  return iVar2;
}

Assistant:

static int gost_ciphers(ENGINE *e, const EVP_CIPHER **cipher,
                        const int **nids, int nid)
{
    int i;

    if (!cipher) {
        int *n = known_cipher_nids;

        *nids = n;
        for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
            *n++ = gost_cipher_array[i]->nid;
        return i;
    }

    for (i = 0; i < OSSL_NELEM(gost_cipher_array); i++)
        if (nid == gost_cipher_array[i]->nid) {
            *cipher = GOST_init_cipher(gost_cipher_array[i]);
            return 1;
        }
    *cipher = NULL;
    return 0;
}